

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

SorterRecord * vdbeSorterMerge(SortSubtask *pTask,SorterRecord *p1,SorterRecord *p2)

{
  anon_union_8_2_0134e7e8_for_u *paVar1;
  int iVar2;
  anon_union_8_2_0134e7e8_for_u *paVar3;
  int bCached;
  SorterRecord *pFinal;
  int local_3c;
  anon_union_8_2_0134e7e8_for_u local_38;
  
  paVar3 = &local_38;
  local_38.pNext = (SorterRecord *)0x0;
  do {
    local_3c = 0;
    while (iVar2 = (*pTask->xCompare)(pTask,&local_3c,p1 + 1,p1->nVal,p2 + 1,p2->nVal), iVar2 < 1) {
      paVar3->pNext = p1;
      paVar1 = &p1->u;
      paVar3 = &p1->u;
      p1 = paVar1->pNext;
      if (paVar1->pNext == (SorterRecord *)0x0) {
        paVar3->pNext = p2;
        return local_38.pNext;
      }
    }
    paVar3->pNext = p2;
    paVar1 = &p2->u;
    paVar3 = &p2->u;
    p2 = paVar1->pNext;
    if (paVar1->pNext == (SorterRecord *)0x0) {
      paVar3->pNext = p1;
      return local_38.pNext;
    }
  } while( true );
}

Assistant:

static SorterRecord *vdbeSorterMerge(
  SortSubtask *pTask,             /* Calling thread context */
  SorterRecord *p1,               /* First list to merge */
  SorterRecord *p2                /* Second list to merge */
){
  SorterRecord *pFinal = 0;
  SorterRecord **pp = &pFinal;
  int bCached = 0;

  assert( p1!=0 && p2!=0 );
  for(;;){
    int res;
    res = pTask->xCompare(
        pTask, &bCached, SRVAL(p1), p1->nVal, SRVAL(p2), p2->nVal
    );

    if( res<=0 ){
      *pp = p1;
      pp = &p1->u.pNext;
      p1 = p1->u.pNext;
      if( p1==0 ){
        *pp = p2;
        break;
      }
    }else{
      *pp = p2;
      pp = &p2->u.pNext;
      p2 = p2->u.pNext;
      bCached = 0;
      if( p2==0 ){
        *pp = p1;
        break;
      }
    }
  }
  return pFinal;
}